

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

type fmt::v5::
     visit<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
               (arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                *vis,basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                     *arg)

{
  basic_string_view<char> value;
  type tVar1;
  iterator iVar2;
  char_spec_handler local_18;
  
  switch(arg->type_) {
  case named_arg_type:
    __assert_fail("(false) && \"invalid argument type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/lib/logging/spdlog/fmt/bundled/core.h"
                  ,0x314,
                  "typename internal::result_of<Visitor (int)>::type fmt::visit(Visitor &&, const basic_format_arg<Context> &) [Visitor = fmt::arg_formatter<fmt::back_insert_range<fmt::internal::basic_buffer<char>>>, Context = fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>]"
                 );
  case int_type:
    tVar1 = internal::
            arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
            operator()((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
                        *)vis,(arg->value_).field_0.int_value);
    return (type)tVar1.container;
  case uint_type:
    tVar1 = internal::
            arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
            operator()((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
                        *)vis,(arg->value_).field_0.uint_value);
    return (type)tVar1.container;
  case long_long_type:
    tVar1 = internal::
            arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
            operator()((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
                        *)vis,(arg->value_).field_0.long_long_value);
    return (type)tVar1.container;
  case ulong_long_type:
    tVar1 = internal::
            arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
            operator()((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
                        *)vis,(arg->value_).field_0.ulong_long_value);
    return (type)tVar1.container;
  case bool_type:
    tVar1 = internal::
            arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
            operator()((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
                        *)vis,(arg->value_).field_0.int_value != 0);
    return (type)tVar1.container;
  case char_type:
    local_18.value = *(char_type *)&(arg->value_).field_0;
    local_18.formatter =
         &vis->
          super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
    ;
    internal::
    handle_char_specs<char,fmt::v5::internal::arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::char_spec_handler>
              ((vis->
               super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
               ).specs_,&local_18);
    break;
  case double_type:
    tVar1 = internal::
            arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
            operator()((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
                        *)vis,(arg->value_).field_0.double_value);
    return (type)tVar1.container;
  case last_numeric_type:
    tVar1 = internal::
            arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
            operator()((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
                        *)vis,(arg->value_).field_0.long_double_value);
    return (type)tVar1.container;
  case cstring_type:
    iVar2 = internal::
            arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
            ::operator()(&vis->
                          super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                         ,(arg->value_).field_0.string.value);
    return (type)iVar2.container;
  case string_type:
    value.data_ = *(char **)&(arg->value_).field_0;
    value.size_ = *(size_t *)((long)&(arg->value_).field_0 + 8);
    iVar2 = internal::
            arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
            ::operator()(&vis->
                          super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                         ,value);
    return (type)iVar2.container;
  case pointer_type:
    iVar2 = internal::
            arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
            ::operator()(&vis->
                          super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                         ,(arg->value_).field_0.pointer);
    return (type)iVar2.container;
  case custom_type:
    (*(arg->value_).field_0.custom.format)((void *)(arg->value_).field_0.long_long_value,vis->ctx_);
    break;
  default:
    __assert_fail("(false) && \"invalid argument type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/lib/logging/spdlog/fmt/bundled/format.h"
                  ,0x5c7,
                  "<dependent type> fmt::internal::arg_formatter_base<fmt::back_insert_range<fmt::internal::basic_buffer<char>>>::operator()(monostate) [Range = fmt::back_insert_range<fmt::internal::basic_buffer<char>>]"
                 );
  }
  return (type)(vis->
               super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
               ).writer_.out_.container;
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}